

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_buf_mgr.c
# Opt level: O0

WORD32 ihevc_buf_mgr_check_free(buf_mgr_t *ps_buf_mgr)

{
  uint *in_RDI;
  UWORD32 id;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    if (*in_RDI <= local_14) {
      return 0;
    }
    if (in_RDI[(ulong)local_14 + 2] == 2) break;
    if ((in_RDI[(ulong)local_14 + 2] == 0) && (*(long *)(in_RDI + (ulong)local_14 * 2 + 0x42) != 0))
    {
      return 1;
    }
    local_14 = local_14 + 1;
  }
  __assert_fail("(ps_buf_mgr->au4_status[id] != 2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/ihevc_buf_mgr.c"
                ,0xd5,"WORD32 ihevc_buf_mgr_check_free(buf_mgr_t *)");
}

Assistant:

WORD32 ihevc_buf_mgr_check_free(
                buf_mgr_t *ps_buf_mgr)
{
    UWORD32 id;

    for(id = 0; id < ps_buf_mgr->u4_max_buf_cnt; id++)
    {
        ASSERT(ps_buf_mgr->au4_status[id] != 2);

        if((ps_buf_mgr->au4_status[id] == 0) &&
           (ps_buf_mgr->apv_ptr[id]))
        {
            return 1;
        }
    }

    return 0;

}